

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5SeekCursor(Fts5Cursor *pCsr,int bErrormsg)

{
  int *piVar1;
  sqlite3_vtab *psVar2;
  Fts5Storage *p;
  Fts5FullTable *p_00;
  sqlite3_stmt *pStmt;
  Fts5Config *pFVar3;
  int iVar4;
  int iVar5;
  i64 iVar6;
  char *pcVar7;
  char **pzErrMsg;
  ulong uVar8;
  
  iVar4 = 0;
  if (pCsr->pStmt == (sqlite3_stmt *)0x0) {
    psVar2 = (pCsr->base).pVtab;
    uVar8 = 2;
    if (pCsr->ePlan == 5) {
      uVar8 = (ulong)(pCsr->bDesc != 0);
    }
    p = (Fts5Storage *)psVar2[1].zErrMsg;
    pzErrMsg = (char **)0x0;
    if (bErrormsg != 0) {
      pzErrMsg = &psVar2->zErrMsg;
    }
    iVar4 = fts5StorageGetStmt(p,(int)uVar8,&pCsr->pStmt,pzErrMsg);
    if (iVar4 == 0) {
      p->aStmt[uVar8] = (sqlite3_stmt *)0x0;
    }
  }
  if ((iVar4 == 0) && (iVar4 = 0, (pCsr->csrflags & 2) != 0)) {
    p_00 = (Fts5FullTable *)(pCsr->base).pVtab;
    sqlite3_reset(pCsr->pStmt);
    pStmt = pCsr->pStmt;
    iVar6 = fts5CursorRowid(pCsr);
    sqlite3_bind_int64(pStmt,1,iVar6);
    piVar1 = &((p_00->p).pConfig)->bLock;
    *piVar1 = *piVar1 + 1;
    iVar5 = sqlite3_step(pCsr->pStmt);
    piVar1 = &((p_00->p).pConfig)->bLock;
    *piVar1 = *piVar1 + -1;
    if (iVar5 == 100) {
      *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xfd;
    }
    else {
      iVar4 = sqlite3_reset(pCsr->pStmt);
      if (iVar4 == 0) {
        iVar6 = fts5CursorRowid(pCsr);
        fts5SetVtabError(p_00,"fts5: missing row %lld from content table %s",iVar6,
                         ((p_00->p).pConfig)->zContent);
        iVar4 = 0x10b;
      }
      else {
        pFVar3 = (p_00->p).pConfig;
        if (pFVar3->pzErrmsg != (char **)0x0) {
          pcVar7 = sqlite3_errmsg(pFVar3->db);
          fts5SetVtabError(p_00,"%s",pcVar7);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int fts5SeekCursor(Fts5Cursor *pCsr, int bErrormsg){
  int rc = SQLITE_OK;

  /* If the cursor does not yet have a statement handle, obtain one now. */
  if( pCsr->pStmt==0 ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
    int eStmt = fts5StmtType(pCsr);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, eStmt, &pCsr->pStmt, (bErrormsg?&pTab->p.base.zErrMsg:0)
    );
    assert( rc!=SQLITE_OK || pTab->p.base.zErrMsg==0 );
    assert( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) );
  }

  if( rc==SQLITE_OK && CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) ){
    Fts5Table *pTab = (Fts5Table*)(pCsr->base.pVtab);
    assert( pCsr->pExpr );
    sqlite3_reset(pCsr->pStmt);
    sqlite3_bind_int64(pCsr->pStmt, 1, fts5CursorRowid(pCsr));
    pTab->pConfig->bLock++;
    rc = sqlite3_step(pCsr->pStmt);
    pTab->pConfig->bLock--;
    if( rc==SQLITE_ROW ){
      rc = SQLITE_OK;
      CsrFlagClear(pCsr, FTS5CSR_REQUIRE_CONTENT);
    }else{
      rc = sqlite3_reset(pCsr->pStmt);
      if( rc==SQLITE_OK ){
        rc = FTS5_CORRUPT;
        fts5SetVtabError((Fts5FullTable*)pTab,
            "fts5: missing row %lld from content table %s",
            fts5CursorRowid(pCsr),
            pTab->pConfig->zContent
        );
      }else if( pTab->pConfig->pzErrmsg ){
        fts5SetVtabError((Fts5FullTable*)pTab,
            "%s", sqlite3_errmsg(pTab->pConfig->db)
        );
      }
    }
  }
  return rc;
}